

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::ExceptionGuard::~ExceptionGuard(ExceptionGuard *this)

{
  String *pSVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  OutputDirective *pOVar4;
  
  pOVar4 = this->pos;
  if (this->start < pOVar4) {
    do {
      this->pos = pOVar4 + -1;
      if ((pOVar4[-1].dir.ptr.isSet == true) &&
         (pSVar1 = pOVar4[-1].dir.ptr.field_1.value.parts.ptr, pSVar1 != (String *)0x0)) {
        sVar2 = pOVar4[-1].dir.ptr.field_1.value.parts.size_;
        pOVar4[-1].dir.ptr.field_1.value.parts.ptr = (String *)0x0;
        pOVar4[-1].dir.ptr.field_1.value.parts.size_ = 0;
        pAVar3 = pOVar4[-1].dir.ptr.field_1.value.parts.disposer;
        (**pAVar3->_vptr_ArrayDisposer)
                  (pAVar3,pSVar1,0x18,sVar2,sVar2,ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      pOVar4 = this->pos;
    } while (this->start < pOVar4);
  }
  return;
}

Assistant:

~ExceptionGuard() noexcept(false) {
      while (pos > start) {
        dtor(*--pos);
      }
    }